

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  action *__s;
  action *paVar1;
  long lVar2;
  bool bVar3;
  
  __s = Action_new_actionfreelist;
  if (Action_new_actionfreelist == (action *)0x0) {
    __s = (action *)lemon_malloc(4000);
    memset(__s,0,0xf98);
    lVar2 = 99;
    paVar1 = __s;
    while( true ) {
      bVar3 = lVar2 == 0;
      lVar2 = lVar2 + -1;
      if (bVar3) break;
      paVar1->next = paVar1 + 1;
      paVar1 = paVar1 + 1;
    }
    __s[99].next = (action *)0x0;
  }
  Action_new_actionfreelist = __s->next;
  __s->next = *app;
  *app = __s;
  __s->type = type;
  __s->sp = sp;
  __s->spOpt = (symbol *)0x0;
  (__s->x).stp = (state *)arg;
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}